

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int serialize_cert(X509 *cert,ptls_iovec_t *dst)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *local_30;
  uchar *p;
  ptls_iovec_t *ppStack_20;
  int len;
  ptls_iovec_t *dst_local;
  X509 *cert_local;
  
  ppStack_20 = dst;
  dst_local = (ptls_iovec_t *)cert;
  p._4_4_ = i2d_X509((X509 *)cert,(uchar **)0x0);
  if (p._4_4_ < 1) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                  0x65a,"int serialize_cert(X509 *, ptls_iovec_t *)");
  }
  puVar2 = (uint8_t *)malloc((long)p._4_4_);
  ppStack_20->base = puVar2;
  if (puVar2 == (uint8_t *)0x0) {
    cert_local._4_4_ = 0x201;
  }
  else {
    local_30 = ppStack_20->base;
    iVar1 = i2d_X509((X509 *)dst_local,&local_30);
    ppStack_20->len = (long)iVar1;
    if ((long)p._4_4_ != ppStack_20->len) {
      __assert_fail("len == dst->len",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x660,"int serialize_cert(X509 *, ptls_iovec_t *)");
    }
    cert_local._4_4_ = 0;
  }
  return cert_local._4_4_;
}

Assistant:

static int serialize_cert(X509 *cert, ptls_iovec_t *dst)
{
    int len = i2d_X509(cert, NULL);
    assert(len > 0);

    if ((dst->base = malloc(len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    unsigned char *p = dst->base;
    dst->len = i2d_X509(cert, &p);
    assert(len == dst->len);

    return 0;
}